

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality.cpp
# Opt level: O3

ScalarFunction * duckdb::CardinalityFun::GetFunction(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_a1;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  code *local_88;
  LogicalType local_80;
  undefined1 local_7f;
  undefined8 local_78;
  undefined8 uStack_70;
  LogicalType local_68 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_50;
  LogicalType local_38 [24];
  
  duckdb::LogicalType::LogicalType(&local_80,ANY);
  __l._M_len = 1;
  __l._M_array = &local_80;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_50,__l,&local_a1);
  duckdb::LogicalType::LogicalType(local_68,UBIGINT);
  local_98 = 0;
  local_a0 = CardinalityFunction;
  local_88 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_38,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_38);
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,3);
  }
  duckdb::LogicalType::~LogicalType(local_68);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_50);
  duckdb::LogicalType::~LogicalType(&local_80);
  duckdb::LogicalType::LogicalType(&local_80,ANY);
  in_RDI->field_0x78 = local_80;
  in_RDI->field_0x79 = local_7f;
  uVar1 = *(undefined8 *)&in_RDI->field_0x80;
  uVar2 = *(undefined8 *)&in_RDI->field_0x88;
  *(undefined8 *)&in_RDI->field_0x80 = local_78;
  *(undefined8 *)&in_RDI->field_0x88 = uStack_70;
  local_78 = uVar1;
  uStack_70 = uVar2;
  duckdb::LogicalType::~LogicalType(&local_80);
  in_RDI->field_0xa9 = 0;
  return in_RDI;
}

Assistant:

ScalarFunction CardinalityFun::GetFunction() {
	ScalarFunction fun({LogicalType::ANY}, LogicalType::UBIGINT, CardinalityFunction, CardinalityBind);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::DEFAULT_NULL_HANDLING;
	return fun;
}